

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontext.cpp
# Opt level: O0

void __thiscall CGameContext::Clear(CGameContext *this)

{
  long lVar1;
  CVoteOptionServer *pCVar2;
  CVoteOptionServer *pCVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  CTuneParam CVar20;
  CTuneParam CVar21;
  CTuneParam CVar22;
  CTuneParam CVar23;
  CTuneParam CVar24;
  CTuneParam CVar25;
  CTuneParam CVar26;
  CTuneParam CVar27;
  CTuneParam CVar28;
  CTuneParam CVar29;
  CTuneParam CVar30;
  CTuneParam CVar31;
  CTuneParam CVar32;
  CTuneParam CVar33;
  CTuneParam CVar34;
  CTuneParam CVar35;
  CGameContext *in_RDI;
  long in_FS_OFFSET;
  int NumVoteOptions;
  CVoteOptionServer *pVoteOptionLast;
  CVoteOptionServer *pVoteOptionFirst;
  CHeap *pVoteOptionHeap;
  CTuningParams Tuning;
  undefined4 in_stack_ffffffffffffff50;
  int iVar36;
  CHeap *pCVar37;
  CGameContext *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar37 = in_RDI->m_pVoteOptionHeap;
  pCVar2 = in_RDI->m_pVoteOptionFirst;
  pCVar3 = in_RDI->m_pVoteOptionLast;
  iVar36 = in_RDI->m_NumVoteOptions;
  CVar20.m_Value = (in_RDI->m_Tuning).m_LaserBounceNum.m_Value;
  CVar21.m_Value = (in_RDI->m_Tuning).m_LaserBounceCost.m_Value;
  CVar22.m_Value = (in_RDI->m_Tuning).m_PlayerCollision.m_Value;
  CVar23.m_Value = (in_RDI->m_Tuning).m_PlayerHooking.m_Value;
  CVar24.m_Value = (in_RDI->m_Tuning).m_GrenadeSpeed.m_Value;
  CVar25.m_Value = (in_RDI->m_Tuning).m_GrenadeLifetime.m_Value;
  CVar26.m_Value = (in_RDI->m_Tuning).m_LaserReach.m_Value;
  CVar27.m_Value = (in_RDI->m_Tuning).m_LaserBounceDelay.m_Value;
  CVar28.m_Value = (in_RDI->m_Tuning).m_ShotgunSpeed.m_Value;
  CVar29.m_Value = (in_RDI->m_Tuning).m_ShotgunSpeeddiff.m_Value;
  CVar30.m_Value = (in_RDI->m_Tuning).m_ShotgunLifetime.m_Value;
  CVar31.m_Value = (in_RDI->m_Tuning).m_GrenadeCurvature.m_Value;
  CVar32.m_Value = (in_RDI->m_Tuning).m_GunCurvature.m_Value;
  CVar33.m_Value = (in_RDI->m_Tuning).m_GunSpeed.m_Value;
  CVar34.m_Value = (in_RDI->m_Tuning).m_GunLifetime.m_Value;
  CVar35.m_Value = (in_RDI->m_Tuning).m_ShotgunCurvature.m_Value;
  iVar4 = (in_RDI->m_Tuning).m_GroundControlSpeed.m_Value;
  iVar5 = (in_RDI->m_Tuning).m_GroundControlAccel.m_Value;
  iVar6 = (in_RDI->m_Tuning).m_GroundFriction.m_Value;
  iVar7 = (in_RDI->m_Tuning).m_GroundJumpImpulse.m_Value;
  iVar8 = (in_RDI->m_Tuning).m_AirJumpImpulse.m_Value;
  iVar9 = (in_RDI->m_Tuning).m_AirControlSpeed.m_Value;
  iVar10 = (in_RDI->m_Tuning).m_AirControlAccel.m_Value;
  iVar11 = (in_RDI->m_Tuning).m_AirFriction.m_Value;
  iVar12 = (in_RDI->m_Tuning).m_HookLength.m_Value;
  iVar13 = (in_RDI->m_Tuning).m_HookFireSpeed.m_Value;
  iVar14 = (in_RDI->m_Tuning).m_HookDragAccel.m_Value;
  iVar15 = (in_RDI->m_Tuning).m_HookDragSpeed.m_Value;
  iVar16 = (in_RDI->m_Tuning).m_Gravity.m_Value;
  iVar17 = (in_RDI->m_Tuning).m_VelrampStart.m_Value;
  iVar18 = (in_RDI->m_Tuning).m_VelrampRange.m_Value;
  iVar19 = (in_RDI->m_Tuning).m_VelrampCurvature.m_Value;
  in_RDI->m_Resetting = true;
  this_00 = in_RDI;
  (**(in_RDI->super_IGameServer).super_IInterface._vptr_IInterface)();
  mem_zero((void *)CONCAT44(iVar36,in_stack_ffffffffffffff50),(uint)((ulong)in_RDI >> 0x20));
  CGameContext(this_00,(int)((ulong)pCVar37 >> 0x20));
  in_RDI->m_pVoteOptionHeap = pCVar37;
  in_RDI->m_pVoteOptionFirst = pCVar2;
  in_RDI->m_pVoteOptionLast = pCVar3;
  in_RDI->m_NumVoteOptions = iVar36;
  (in_RDI->m_Tuning).m_LaserBounceNum = (CTuneParam)CVar20.m_Value;
  (in_RDI->m_Tuning).m_LaserBounceCost = (CTuneParam)CVar21.m_Value;
  (in_RDI->m_Tuning).m_PlayerCollision = (CTuneParam)CVar22.m_Value;
  (in_RDI->m_Tuning).m_PlayerHooking = (CTuneParam)CVar23.m_Value;
  (in_RDI->m_Tuning).m_GrenadeSpeed = (CTuneParam)CVar24.m_Value;
  (in_RDI->m_Tuning).m_GrenadeLifetime = (CTuneParam)CVar25.m_Value;
  (in_RDI->m_Tuning).m_LaserReach = (CTuneParam)CVar26.m_Value;
  (in_RDI->m_Tuning).m_LaserBounceDelay = (CTuneParam)CVar27.m_Value;
  (in_RDI->m_Tuning).m_ShotgunSpeed = (CTuneParam)CVar28.m_Value;
  (in_RDI->m_Tuning).m_ShotgunSpeeddiff = (CTuneParam)CVar29.m_Value;
  (in_RDI->m_Tuning).m_ShotgunLifetime = (CTuneParam)CVar30.m_Value;
  (in_RDI->m_Tuning).m_GrenadeCurvature = (CTuneParam)CVar31.m_Value;
  (in_RDI->m_Tuning).m_GunCurvature = (CTuneParam)CVar32.m_Value;
  (in_RDI->m_Tuning).m_GunSpeed = (CTuneParam)CVar33.m_Value;
  (in_RDI->m_Tuning).m_GunLifetime = (CTuneParam)CVar34.m_Value;
  (in_RDI->m_Tuning).m_ShotgunCurvature = (CTuneParam)CVar35.m_Value;
  (in_RDI->m_Tuning).m_Gravity.m_Value = iVar16;
  (in_RDI->m_Tuning).m_VelrampStart.m_Value = iVar17;
  (in_RDI->m_Tuning).m_VelrampRange.m_Value = iVar18;
  (in_RDI->m_Tuning).m_VelrampCurvature.m_Value = iVar19;
  (in_RDI->m_Tuning).m_HookLength.m_Value = iVar12;
  (in_RDI->m_Tuning).m_HookFireSpeed.m_Value = iVar13;
  (in_RDI->m_Tuning).m_HookDragAccel.m_Value = iVar14;
  (in_RDI->m_Tuning).m_HookDragSpeed.m_Value = iVar15;
  (in_RDI->m_Tuning).m_AirJumpImpulse.m_Value = iVar8;
  (in_RDI->m_Tuning).m_AirControlSpeed.m_Value = iVar9;
  (in_RDI->m_Tuning).m_AirControlAccel.m_Value = iVar10;
  (in_RDI->m_Tuning).m_AirFriction.m_Value = iVar11;
  (in_RDI->m_Tuning).m_GroundControlSpeed.m_Value = iVar4;
  (in_RDI->m_Tuning).m_GroundControlAccel.m_Value = iVar5;
  (in_RDI->m_Tuning).m_GroundFriction.m_Value = iVar6;
  (in_RDI->m_Tuning).m_GroundJumpImpulse.m_Value = iVar7;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGameContext::Clear()
{
	CHeap *pVoteOptionHeap = m_pVoteOptionHeap;
	CVoteOptionServer *pVoteOptionFirst = m_pVoteOptionFirst;
	CVoteOptionServer *pVoteOptionLast = m_pVoteOptionLast;
	int NumVoteOptions = m_NumVoteOptions;
	CTuningParams Tuning = m_Tuning;

	m_Resetting = true;
	this->~CGameContext();
	mem_zero(this, sizeof(*this));
	new (this) CGameContext(RESET);

	m_pVoteOptionHeap = pVoteOptionHeap;
	m_pVoteOptionFirst = pVoteOptionFirst;
	m_pVoteOptionLast = pVoteOptionLast;
	m_NumVoteOptions = NumVoteOptions;
	m_Tuning = Tuning;
}